

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_generic_getrawsocket.c
# Opt level: O0

int os_fd_generic_getrawsocket
              (os_fd *sock,netaddr_socket *bind_to,int protocol,size_t recvbuf,os_interface *os_if,
              oonf_log_source log_src)

{
  ushort uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  int family;
  oonf_log_source log_src_local;
  os_interface *os_if_local;
  size_t recvbuf_local;
  int protocol_local;
  netaddr_socket *bind_to_local;
  os_fd *sock_local;
  int result_1;
  int result;
  
  uVar1 = (bind_to->v4).sin_family;
  iVar2 = socket((uint)uVar1,3,protocol);
  sock->fd = iVar2;
  if (sock->fd < 0) {
    if (((&log_global_mask)[log_src] & 4) != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      piVar3 = __errno_location();
      oonf_log(4,log_src,"src/base/os_generic/os_fd_generic_getrawsocket.c",0x4d,0,0,
               "Cannot open socket: %s (%d)",pcVar4,*piVar3);
    }
    sock_local._4_4_ = -1;
  }
  else if ((uVar1 == 2) &&
          (iVar2 = setsockopt(sock->fd,0,3,&os_fd_generic_getrawsocket::zero,4), iVar2 < 0)) {
    if (((&log_global_mask)[log_src] & 4) != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      piVar3 = __errno_location();
      oonf_log(4,log_src,"src/base/os_generic/os_fd_generic_getrawsocket.c",0x53,0,0,
               "Cannot disable IP_HDRINCL for socket: %s (%d)",pcVar4,*piVar3);
    }
    if (sock->fd != -1) {
      close(sock->fd);
      sock->fd = -1;
    }
    sock_local._4_4_ = -1;
  }
  else {
    iVar2 = os_fd_generic_configsocket(sock,bind_to,recvbuf,true,os_if,log_src);
    if (iVar2 == 0) {
      sock_local._4_4_ = 0;
    }
    else {
      if (sock->fd != -1) {
        close(sock->fd);
        sock->fd = -1;
      }
      sock_local._4_4_ = -1;
    }
  }
  return sock_local._4_4_;
}

Assistant:

int
os_fd_generic_getrawsocket(struct os_fd *sock, const union netaddr_socket *bind_to, int protocol, size_t recvbuf,
  const struct os_interface *os_if, enum oonf_log_source log_src __attribute__((unused))) {
  static const int zero = 0;
  int family;

  family = bind_to->std.sa_family;
  sock->fd = socket(family, SOCK_RAW, protocol);
  if (sock->fd < 0) {
    OONF_WARN(log_src, "Cannot open socket: %s (%d)", strerror(errno), errno);
    return -1;
  }

  if (family == AF_INET) {
    if (setsockopt(sock->fd, IPPROTO_IP, IP_HDRINCL, &zero, sizeof(zero)) < 0) {
      OONF_WARN(log_src, "Cannot disable IP_HDRINCL for socket: %s (%d)", strerror(errno), errno);
      os_fd_close(sock);
      return -1;
    }
  }

  if (os_fd_configsocket(sock, bind_to, recvbuf, true, os_if, log_src)) {
    os_fd_close(sock);
    return -1;
  }
  return 0;
}